

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O2

int checkBufYUV(uchar *buf,int w,int h,int subsamp,tjscalingfactor sf)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  char *__format;
  int iVar13;
  ulong uVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uchar *puVar28;
  uint uVar29;
  uchar *local_90;
  
  iVar24 = tjMCUWidth[(uint)subsamp] / 8;
  iVar3 = tjMCUHeight[(uint)subsamp] / 8;
  uVar29 = -iVar24 & (w + iVar24) - 1U;
  uVar26 = -iVar3 & (h + iVar3) - 1U;
  uVar7 = (long)(int)uVar29 / (long)iVar24 & 0xffffffff;
  uVar5 = (int)uVar26 / iVar3;
  iVar4 = (int)((long)(int)uVar29 / (long)iVar24);
  uVar19 = (pad + uVar29) - 1 & -pad;
  uVar8 = (pad + iVar4) - 1U & -pad;
  iVar13 = sf.num;
  iVar22 = sf.denom;
  iVar12 = (iVar13 * 8) / iVar22;
  uVar23 = 0;
  uVar10 = (ulong)uVar29;
  if ((int)uVar29 < 1) {
    uVar10 = uVar23;
  }
  uVar14 = 0;
  if (0 < (int)uVar26) {
    uVar14 = (ulong)uVar26;
  }
  lVar18 = (long)((iVar13 << 4) / iVar22);
  puVar28 = buf;
  do {
    if (uVar23 == uVar14) {
      if (subsamp != 3) {
        uVar23 = 0;
        uVar25 = 0;
        if (0 < iVar4) {
          uVar25 = uVar7;
        }
        uVar6 = 0;
        if (0 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        local_90 = buf + (int)(uVar19 * uVar26);
        iVar9 = uVar19 * uVar26 + uVar8 * uVar5;
        for (; uVar23 != uVar6; uVar23 = uVar23 + 1) {
          iVar20 = 0;
          for (uVar21 = 0; uVar25 != uVar21; uVar21 = uVar21 + 1) {
            bVar1 = local_90[uVar21];
            uVar16 = (ulong)bVar1;
            bVar2 = buf[(int)uVar21 + iVar9];
            uVar17 = (ulong)bVar2;
            if ((iVar20 / iVar12 + (iVar3 * (int)uVar23) / iVar12 & 1U) == 0) {
              if ((byte)(bVar1 + 0x7e) < 0xfd) {
                pcVar11 = "u";
              }
              else {
                if (0xfc < (byte)(bVar2 + 0x7e)) goto LAB_00104f7e;
                pcVar11 = "v";
                uVar16 = uVar17;
              }
              uVar15 = 0x80;
              uVar17 = uVar16;
              goto LAB_00104cf5;
            }
            if ((long)uVar23 < (long)(((int)(0x10 / (long)iVar3) * iVar13) / iVar22)) {
              if ((byte)(bVar1 + 0xa9) < 0xfd) {
                pcVar11 = "u";
                uVar15 = 0x55;
                uVar17 = uVar16;
                goto LAB_00104cf5;
              }
              if (bVar2 < 0xfe) {
                __format = "\nComp. %s at %d,%d should be 255, not %d\n";
                pcVar11 = "v";
                uVar16 = uVar17;
                goto LAB_00104d15;
              }
            }
            else {
              if (1 < bVar1) {
                __format = "\nComp. %s at %d,%d should be 0, not %d\n";
                pcVar11 = "u";
                goto LAB_00104d15;
              }
              if ((byte)(bVar2 + 0x69) < 0xfd) {
                pcVar11 = "v";
                uVar15 = 0x95;
                goto LAB_00104cf5;
              }
            }
LAB_00104f7e:
            iVar20 = iVar20 + iVar24;
          }
          local_90 = local_90 + (int)uVar8;
          iVar9 = iVar9 + uVar8;
        }
      }
      return 1;
    }
    for (uVar21 = 0; uVar10 != uVar21; uVar21 = uVar21 + 1) {
      bVar1 = puVar28[uVar21];
      if (((int)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) /
                (long)iVar12) +
           (int)((long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff) /
                (long)iVar12) & 1U) == 0) {
        if ((long)uVar23 < lVar18) {
          if (bVar1 < 0xfe) {
            __format = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00104d05:
            pcVar11 = "y";
            uVar23 = uVar23 & 0xffffffff;
            uVar21 = uVar21 & 0xffffffff;
            uVar16 = (ulong)bVar1;
LAB_00104d15:
            printf(__format,pcVar11,uVar23,uVar21,uVar16);
            goto LAB_00104d1c;
          }
        }
        else if (1 < bVar1) {
          __format = "\nComp. %s at %d,%d should be 0, not %d\n";
          goto LAB_00104d05;
        }
      }
      else if ((long)uVar23 < lVar18) {
        if ((byte)(bVar1 + 0xb2) < 0xfd) {
          uVar15 = 0x4c;
LAB_00104cf2:
          uVar23 = uVar23 & 0xffffffff;
          uVar21 = uVar21 & 0xffffffff;
          pcVar11 = "y";
          uVar17 = (ulong)bVar1;
LAB_00104cf5:
          printf("\nComp. %s at %d,%d should be %d, not %d\n",pcVar11,uVar23,uVar21,uVar15,uVar17);
LAB_00104d1c:
          exitStatus = -1;
          puVar28 = buf;
          for (uVar23 = 0; uVar23 != uVar14; uVar23 = uVar23 + 1) {
            for (uVar25 = 0; uVar10 != uVar25; uVar25 = uVar25 + 1) {
              printf("%.3d ",(ulong)puVar28[uVar25]);
            }
            putchar(10);
            puVar28 = puVar28 + (int)uVar19;
          }
          putchar(10);
          if (iVar4 < 1) {
            uVar7 = 0;
          }
          uVar29 = 0;
          if (0 < (int)uVar5) {
            uVar29 = uVar5;
          }
          iVar24 = uVar19 * uVar26;
          for (uVar27 = 0; uVar10 = uVar7, iVar3 = iVar24, uVar27 != uVar29; uVar27 = uVar27 + 1) {
            while (uVar10 != 0) {
              printf("%.3d ",(ulong)buf[iVar3]);
              uVar10 = uVar10 - 1;
              iVar3 = iVar3 + 1;
            }
            putchar(10);
            iVar24 = iVar24 + uVar8;
          }
          putchar(10);
          iVar24 = uVar19 * uVar26 + uVar5 * uVar8;
          for (uVar5 = 0; uVar10 = uVar7, iVar3 = iVar24, uVar5 != uVar29; uVar5 = uVar5 + 1) {
            while (uVar10 != 0) {
              printf("%.3d ",(ulong)buf[iVar3]);
              uVar10 = uVar10 - 1;
              iVar3 = iVar3 + 1;
            }
            putchar(10);
            iVar24 = iVar24 + uVar8;
          }
          return 0;
        }
      }
      else if ((byte)(bVar1 + 0x1c) < 0xfd) {
        uVar15 = 0xe2;
        goto LAB_00104cf2;
      }
    }
    uVar23 = uVar23 + 1;
    puVar28 = puVar28 + (int)uVar19;
  } while( true );
}

Assistant:

static int checkBufYUV(unsigned char *buf, int w, int h, int subsamp,
                       tjscalingfactor sf)
{
  int row, col;
  int hsf = tjMCUWidth[subsamp] / 8, vsf = tjMCUHeight[subsamp] / 8;
  int pw = PAD(w, hsf), ph = PAD(h, vsf);
  int cw = pw / hsf, ch = ph / vsf;
  int ypitch = PAD(pw, pad), uvpitch = PAD(cw, pad);
  int retval = 1;
  int halfway = 16 * sf.num / sf.denom;
  int blocksize = 8 * sf.num / sf.denom;

  for (row = 0; row < ph; row++) {
    for (col = 0; col < pw; col++) {
      unsigned char y = buf[ypitch * row + col];

      if (((row / blocksize) + (col / blocksize)) % 2 == 0) {
        if (row < halfway) CHECKVAL255(y)
        else CHECKVAL0(y);
      } else {
        if (row < halfway) CHECKVAL(y, 76)
        else CHECKVAL(y, 226);
      }
    }
  }
  if (subsamp != TJSAMP_GRAY) {
    halfway = 16 / vsf * sf.num / sf.denom;

    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++) {
        unsigned char u = buf[ypitch * ph + (uvpitch * row + col)],
          v = buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)];

        if (((row * vsf / blocksize) + (col * hsf / blocksize)) % 2 == 0) {
          CHECKVAL(u, 128);  CHECKVAL(v, 128);
        } else {
          if (row < halfway) {
            CHECKVAL(u, 85);  CHECKVAL255(v);
          } else {
            CHECKVAL0(u);  CHECKVAL(v, 149);
          }
        }
      }
    }
  }

bailout:
  if (retval == 0) {
    for (row = 0; row < ph; row++) {
      for (col = 0; col < pw; col++)
        printf("%.3d ", buf[ypitch * row + col]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ", buf[ypitch * ph + (uvpitch * row + col)]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ",
               buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)]);
      printf("\n");
    }
  }

  return retval;
}